

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tape.cpp
# Opt level: O3

unique_ptr<BasicTape,_std::default_delete<BasicTape>_> __thiscall
TapeGenerator::generate(TapeGenerator *this,int64_t opt)

{
  StandardTape *this_00;
  runtime_error *this_01;
  
  if ((((uint)opt * 2 | (uint)opt) & 8) == 0) {
    this_00 = (StandardTape *)operator_new(0x38);
    StandardTape::StandardTape(this_00,opt);
    *(StandardTape **)this = this_00;
    return (__uniq_ptr_data<BasicTape,_std::default_delete<BasicTape>,_true,_true>)
           (__uniq_ptr_data<BasicTape,_std::default_delete<BasicTape>,_true,_true>)this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Runtime Error: Unknown tape type");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<BasicTape> TapeGenerator::generate(int64_t opt) {
    using namespace wtlgo::bf;
    uint8_t var = (opt & WRAPPING_TAPE) * 2 + (opt & INFINITE_TAPE);
    switch (var) {
        case true  * 2 + true : return std::make_unique<InfiniteWrappingTape>(opt);
        case true  * 2 + false: return std::make_unique<WrappingTape>(opt);
        case false * 2 + true : return std::make_unique<InfiniteTape>(opt);
        case false * 2 + false: return std::make_unique<StandardTape>(opt);
    
        default: throw std::runtime_error("Runtime Error: Unknown tape type");
    }

    return nullptr; 
}